

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  _func_void *p_Var1;
  ALLEGRO_SYSTEM *pAVar2;
  undefined8 *puVar3;
  long lVar4;
  uint idx;
  byte bVar5;
  
  bVar5 = 0;
  pAVar2 = al_get_system_driver();
  p_Var1 = pAVar2->vt->heartbeat;
  if (p_Var1 != (_func_void *)0x0) {
    (*p_Var1)();
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  idx = queue->events_tail;
  if (queue->events_head == idx) {
    do {
      pthread_cond_wait((pthread_cond_t *)&queue->cond,(pthread_mutex_t *)&(queue->mutex).mutex);
      idx = queue->events_tail;
    } while (queue->events_head == idx);
  }
  if (ret_event != (ALLEGRO_EVENT *)0x0) {
    puVar3 = (undefined8 *)_al_vector_ref(&queue->events,idx);
    queue->events_tail = (uint)((ulong)(queue->events_tail + 1) % (queue->events)._size);
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)ret_event = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar5 * -0x10 + 8);
    }
  }
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
    return;
  }
  return;
}

Assistant:

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event = NULL;

   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);
   {
      while (is_event_queue_empty(queue)) {
         _al_cond_wait(&queue->cond, &queue->mutex);
      }

      if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);
}